

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_uninitialized_temporary
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
  *ppVar3;
  size_t sVar4;
  bool bVar5;
  size_type sVar6;
  SPIRType *type;
  Bitset *flags;
  mapped_type *name;
  SPIRBlock *pSVar7;
  pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
  *ppVar8;
  pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
  *ppVar9;
  long lVar10;
  __hashtable *__h;
  string initializer;
  ID local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b4.id = result_id;
  if ((this->block_temporary_hoisting != false) ||
     (this->current_continue_block == (SPIRBlock *)0x0)) {
LAB_0075879e:
    sVar6 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).hoisted_temporaries._M_h,&local_b4.id);
    if (sVar6 == 0) {
      type = Variant::get<diligent_spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.
                        super_VectorView<diligent_spirv_cross::Variant>.ptr + result_type);
      flags = Compiler::get_decoration_bitset(&this->super_Compiler,local_b4);
      local_70._M_dataplus._M_p._0_4_ = local_b4.id;
      name = ::std::__detail::
             _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_Compiler).ir.meta,(key_type *)&local_70);
      add_variable(this,&this->local_variable_names,&this->block_names,(string *)name);
      paVar1 = &local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)paVar1;
      if (((this->options).force_zero_initialized_variables == true) &&
         (bVar5 = type_can_zero_initialize(this,type), bVar5)) {
        (*(this->super_Compiler)._vptr_Compiler[0x3b])(&local_b0,this,(ulong)result_type);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_90,(diligent_spirv_cross *)0x90c1db,(char (*) [4])&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
        ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      flags_to_qualifiers_glsl_abi_cxx11_(&local_90,this,type,flags);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_50,this,(ulong)local_b4.id,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_b0,this,type,local_50,0);
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,&local_90,&local_b0,&local_70,(char (*) [2])0x9301ce);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    return;
  }
  this_00 = &(this->super_Compiler).hoisted_temporaries;
  sVar6 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this_00->_M_h,&local_b4.id);
  if (sVar6 != 0) goto LAB_0075879e;
  pSVar7 = Variant::get<diligent_spirv_cross::SPIRBlock>
                     ((this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                      ptr + (this->current_continue_block->loop_dominator).id);
  ppVar8 = (pSVar7->declare_temporary).
           super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
           .ptr;
  uVar2 = (pSVar7->declare_temporary).
          super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
          .buffer_size;
  ppVar3 = ppVar8 + uVar2;
  ppVar9 = ppVar8;
  if (0 < (long)uVar2 >> 2) {
    ppVar9 = ppVar8 + (uVar2 & 0xfffffffffffffffc);
    lVar10 = ((long)uVar2 >> 2) + 1;
    ppVar8 = ppVar8 + 2;
    do {
      if ((ppVar8[-2].first.id == result_type) && (ppVar8[-2].second.id == local_b4.id)) {
        ppVar8 = ppVar8 + -2;
        goto LAB_00758a48;
      }
      if ((ppVar8[-1].first.id == result_type) && (ppVar8[-1].second.id == local_b4.id)) {
        ppVar8 = ppVar8 + -1;
        goto LAB_00758a48;
      }
      if (((ppVar8->first).id == result_type) && ((ppVar8->second).id == local_b4.id))
      goto LAB_00758a48;
      if ((ppVar8[1].first.id == result_type) && (ppVar8[1].second.id == local_b4.id)) {
        ppVar8 = ppVar8 + 1;
        goto LAB_00758a48;
      }
      lVar10 = lVar10 + -1;
      ppVar8 = ppVar8 + 4;
    } while (1 < lVar10);
  }
  lVar10 = (long)ppVar3 - (long)ppVar9 >> 3;
  if (lVar10 != 1) {
    ppVar8 = ppVar9;
    if (lVar10 != 2) {
      ppVar8 = ppVar3;
      if ((lVar10 != 3) ||
         (((ppVar9->first).id == result_type &&
          (ppVar8 = ppVar9, (ppVar9->second).id == local_b4.id)))) goto LAB_00758a48;
      ppVar8 = ppVar9 + 1;
    }
    if (((ppVar8->first).id == result_type) && ((ppVar8->second).id == local_b4.id))
    goto LAB_00758a48;
    ppVar9 = ppVar8 + 1;
  }
  ppVar8 = ppVar3;
  if (((ppVar9->first).id == result_type) && (ppVar8 = ppVar9, (ppVar9->second).id != local_b4.id))
  {
    ppVar8 = ppVar3;
  }
LAB_00758a48:
  if (ppVar8 != ppVar3) {
    return;
  }
  SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_8UL>
  ::reserve(&pSVar7->declare_temporary,uVar2 + 1);
  ppVar3 = (pSVar7->declare_temporary).
           super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
           .ptr;
  sVar4 = (pSVar7->declare_temporary).
          super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
          .buffer_size;
  ppVar3[sVar4].first.id = result_type;
  ppVar3[sVar4].second.id = local_b4.id;
  (pSVar7->declare_temporary).
  super_VectorView<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>_>
  .buffer_size = sVar4 + 1;
  local_70._M_dataplus._M_p = (pointer)this_00;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            (this_00);
  Compiler::force_recompile(&this->super_Compiler);
  return;
}

Assistant:

void CompilerGLSL::emit_uninitialized_temporary(uint32_t result_type, uint32_t result_id)
{
	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (!block_temporary_hoisting && current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile();
		}
	}
	else if (hoisted_temporaries.count(result_id) == 0)
	{
		auto &type = get<SPIRType>(result_type);
		auto &flags = get_decoration_bitset(result_id);

		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);

		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(result_type));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), initializer, ";");
	}
}